

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.h
# Opt level: O0

void __thiscall
highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>
          (HighwayHashCatT<1U> *this,unsigned_long *hash)

{
  size_t buffer_usage;
  HHStateT<1U> state_copy;
  unsigned_long *hash_local;
  HighwayHashCatT<1U> *this_local;
  
  state_copy.mul1[3] = (uint64_t)hash;
  memcpy(&buffer_usage,&this->state_,0x80);
  if (this->buffer_usage_ != 0) {
    Portable::HHStatePortable::UpdateRemainder
              ((HHStatePortable *)state_copy.mul1[1],(char *)state_copy.mul1[0],state_copy.mul0[3]);
  }
  Portable::HHStatePortable::Finalize
            ((HHStatePortable *)&buffer_usage,(HHResult64 *)state_copy.mul1[3]);
  return;
}

Assistant:

HH_INLINE void Finalize(Result* HH_RESTRICT hash) const {
    // BeginIACA();
    HHStateT<Target> state_copy = state_;
    const size_t buffer_usage = buffer_usage_;
    if (HH_LIKELY(buffer_usage != 0)) {
      state_copy.UpdateRemainder(buffer_, buffer_usage);
    }
    state_copy.Finalize(hash);
    // EndIACA();
  }